

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_f.c
# Opt level: O0

int ffcalc_rng(fitsfile *infptr,char *expr,fitsfile *outfptr,char *parName,char *parInfo,int nRngs,
              long *start,long *end,int *status)

{
  int iVar1;
  ushort **ppuVar2;
  long lVar3;
  bool bVar4;
  long local_2c8;
  long totaln;
  int local_2b8;
  int i;
  int nPerLp;
  int anyNull;
  LONGLONG nullVal;
  ParseData lParse;
  char tdimKwd [9];
  char nullKwd [9];
  char tform [16];
  char card [81];
  Node *result;
  int colNo;
  int col_cnt;
  long width;
  long repeat;
  long naxes [5];
  long nelem;
  int newNullKwd;
  int typecode;
  int constant;
  int naxis;
  parseInfo Info;
  char *pcStack_40;
  int nRngs_local;
  char *parInfo_local;
  char *parName_local;
  fitsfile *outfptr_local;
  char *expr_local;
  fitsfile *infptr_local;
  
  nelem._0_4_ = 0;
  if (*status != 0) {
    return *status;
  }
  Info.parseVariables.zeros[3]._4_4_ = nRngs;
  memset(&constant,0,0x90);
  iVar1 = ffiprs(infptr,0,expr,5,&constant,naxes + 4,&typecode,&repeat,(ParseData *)&nullVal,status)
  ;
  if (iVar1 != 0) {
    ffcprs((ParseData *)&nullVal);
    return *status;
  }
  bVar4 = naxes[4] < 0;
  if (bVar4) {
    naxes[4] = -naxes[4];
  }
  newNullKwd = (int)bVar4;
  Info._32_8_ = &nullVal;
  result._0_4_ = 0;
  ffpmrk();
  ffgcno(outfptr,0,parName,(int *)&result,status);
  ffcmsg();
  pcStack_40 = parInfo;
  parInfo_local = parName;
  if (*status == 0) {
    if (*status != 0) {
      ffcprs((ParseData *)&nullVal);
      return *status;
    }
    ffkeyn("TDIM",(int)result,&lParse.field_0xe6,status);
    ffgcrd(outfptr,&lParse.field_0xe6,tform + 8,status);
    if (*status == 0) {
      ffptdm(outfptr,(int)result,typecode,&repeat,status);
    }
    else if (*status == 0xca) {
      *status = 0;
      ffcmsg();
      if (1 < typecode) {
        ffptdm(outfptr,(int)result,typecode,&repeat,status);
      }
    }
    if (*status != 0) {
      ffcprs((ParseData *)&nullVal);
      return *status;
    }
  }
  else {
    *status = 0;
    if (*parName == '#') {
      if (newNullKwd == 0) {
        ffcprs((ParseData *)&nullVal);
        ffpmsg("Cannot put tabular result into keyword (ffcalc)");
        *status = 0x1b0;
        return 0x1b0;
      }
      parInfo_local = parName + 1;
      iVar1 = fits_strcasecmp(parInfo_local,"HISTORY");
      if (((iVar1 == 0) || (iVar1 = fits_strcasecmp(parInfo_local,"COMMENT"), iVar1 == 0)) &&
         (constant != 0x10)) {
        ffcprs((ParseData *)&nullVal);
        ffpmsg("HISTORY and COMMENT values must be strings (ffcalc)");
        *status = 0x1b0;
        return 0x1b0;
      }
    }
    else if (newNullKwd == 0) {
      result._0_4_ = -1;
    }
    else {
      iVar1 = ffgcrd(outfptr,parName,tform + 8,status);
      if (iVar1 == 0xca) {
        result._0_4_ = -1;
      }
      else if (*status != 0) {
        ffcprs((ParseData *)&nullVal);
        return *status;
      }
    }
    if ((int)result < 0) {
      *status = 0;
      ffgncl(outfptr,(int *)&result,status);
      result._0_4_ = (int)result + 1;
      if ((parInfo == (char *)0x0) || (*parInfo == '\0')) {
        if (lParse.nPrevDataRows._4_4_ == 2) {
          snprintf(nullKwd + 1,0xf,"%ld",naxes[4]);
          if (constant == 1) {
            strcat(nullKwd + 1,"X");
          }
          else if (constant == 0xe) {
            strcat(nullKwd + 1,"L");
          }
          else if (constant == 0x10) {
            strcat(nullKwd + 1,"A");
          }
          else if (constant == 0x29) {
            strcat(nullKwd + 1,"J");
          }
          else if (constant == 0x51) {
            strcat(nullKwd + 1,"K");
          }
          else if (constant == 0x52) {
            strcat(nullKwd + 1,"D");
          }
        }
        else {
          if (constant != 1) {
            if (constant == 0xe) {
              ffcprs((ParseData *)&nullVal);
              ffpmsg("Cannot create LOGICAL column in ASCII table");
              *status = 0xe3;
              return 0xe3;
            }
            if (constant != 0x10) {
              if (constant == 0x29) {
                strcpy(nullKwd + 1,"I11");
              }
              else if (constant == 0x52) {
                strcpy(nullKwd + 1,"D23.15");
              }
              goto LAB_00154fcf;
            }
          }
          snprintf(nullKwd + 1,0x10,"A%ld",naxes[4]);
        }
LAB_00154fcf:
        pcStack_40 = nullKwd + 1;
      }
      else {
        ppuVar2 = __ctype_b_loc();
        if ((((*ppuVar2)[(int)*parInfo] & 0x800) == 0) && (lParse.nPrevDataRows._4_4_ == 2)) {
          if ((constant == 1) && (*parInfo == 'B')) {
            naxes[4] = (naxes[4] + 7) / 8;
          }
          snprintf(nullKwd + 1,0x10,"%ld%s",naxes[4],parInfo);
          pcStack_40 = nullKwd + 1;
        }
      }
      fficol(outfptr,(int)result,parInfo_local,pcStack_40,status);
      if (1 < typecode) {
        ffptdm(outfptr,(int)result,typecode,&repeat,status);
      }
      ffkeyn("TNULL",(int)result,tdimKwd + 1,status);
      iVar1 = ffgcrd(outfptr,tdimKwd + 1,tform + 8,status);
      if (iVar1 == 0xca) {
        *status = 0;
        if (lParse.nPrevDataRows._4_4_ == 2) {
          _nPerLp = 0;
          ffbnfm(pcStack_40,(int *)((long)&nelem + 4),&width,(long *)&colNo,status);
          if (nelem._4_4_ == 0xb) {
            _nPerLp = 0xff;
          }
          else if (nelem._4_4_ == 0x15) {
            _nPerLp = -0x8000;
          }
          else if (nelem._4_4_ == 0x1f) {
            _nPerLp = -0x80000000;
          }
          else if (nelem._4_4_ == 0x29) {
            _nPerLp = -0x80000000;
          }
          else if (nelem._4_4_ == 0x51) {
            _nPerLp = -0x8000000000000000;
          }
          if (_nPerLp != 0) {
            ffpkyj(outfptr,tdimKwd + 1,_nPerLp,"Null value",status);
            fftnul(outfptr,(int)result,_nPerLp,status);
            nelem._0_4_ = 1;
          }
        }
        else if (lParse.nPrevDataRows._4_4_ == 1) {
          ffpkys(outfptr,tdimKwd + 1,"NULL","Null value string",status);
          ffsnul(outfptr,(int)result,"NULL",status);
          nelem._0_4_ = 1;
        }
      }
    }
  }
  if (0 < (int)result) {
    i = 0;
    ffgkyj(infptr,"NAXIS2",&local_2c8,(char *)0x0,status);
    result._4_4_ = (int)lParse.nRows;
    iVar1 = fits_parser_allocateCol((ParseData *)&nullVal,(int)lParse.nRows,status);
    if (iVar1 != 0) {
      ffcprs((ParseData *)&nullVal);
      return *status;
    }
    fits_iter_set_by_num
              ((iteratorCol *)(lParse.nAxes[4] + (long)result._4_4_ * 0x110),outfptr,(int)result,0,2
              );
    lParse.nRows._0_4_ = (int)lParse.nRows + 1;
    for (totaln._4_4_ = 0; totaln._4_4_ < Info.parseVariables.zeros[3]._4_4_;
        totaln._4_4_ = totaln._4_4_ + 1) {
      Info.datatype = 0;
      Info._4_4_ = 0;
      Info.nullPtr = (void *)((end[totaln._4_4_] - start[totaln._4_4_]) + 1);
      if (((((long)Info.nullPtr < 10) || (Info.parseVariables.zeros[3]._4_4_ != 1)) || (*start != 1)
          ) || (*end != local_2c8)) {
        local_2b8 = (int)Info.nullPtr;
      }
      else {
        local_2b8 = 0;
      }
      iVar1 = ffiter((int)lParse.nRows,(iteratorCol *)lParse.nAxes[4],start[totaln._4_4_] + -1,
                     (long)local_2b8,fits_parser_workfn,&constant,status);
      if (iVar1 == -1) {
        *status = 0;
      }
      else if (*status != 0) {
        ffcprs((ParseData *)&nullVal);
        return *status;
      }
      if ((int)Info.maxRows != 0) {
        i = 1;
      }
    }
    if (((int)nelem != 0) && (i == 0)) {
      ffdkey(outfptr,tdimKwd + 1,status);
    }
    goto LAB_001556e7;
  }
  lVar3 = lParse._48_8_ + (long)lParse.nNodes * 0x180;
  if (constant != 1) {
    if (constant == 0xe) {
      ffukyl(outfptr,parInfo_local,(int)*(char *)(lVar3 + 0x80),pcStack_40,status);
      goto LAB_001556e7;
    }
    if (constant != 0x10) {
      if (constant == 0x29) {
        ffukyj(outfptr,parInfo_local,*(LONGLONG *)(lVar3 + 0x80),pcStack_40,status);
      }
      else if (constant == 0x52) {
        ffukyd(outfptr,parInfo_local,*(double *)(lVar3 + 0x80),0xf,pcStack_40,status);
      }
      goto LAB_001556e7;
    }
  }
  iVar1 = fits_strcasecmp(parInfo_local,"HISTORY");
  if (iVar1 == 0) {
    ffphis(outfptr,(char *)(lVar3 + 0x80),status);
  }
  else {
    iVar1 = fits_strcasecmp(parInfo_local,"COMMENT");
    if (iVar1 == 0) {
      ffpcom(outfptr,(char *)(lVar3 + 0x80),status);
    }
    else {
      ffukys(outfptr,parInfo_local,(char *)(lVar3 + 0x80),pcStack_40,status);
    }
  }
LAB_001556e7:
  ffcprs((ParseData *)&nullVal);
  return *status;
}

Assistant:

int ffcalc_rng( fitsfile *infptr,   /* I - Input FITS file                  */
                char     *expr,     /* I - Arithmetic expression            */
                fitsfile *outfptr,  /* I - Output fits file                 */
                char     *parName,  /* I - Name of output parameter         */
                char     *parInfo,  /* I - Extra information on parameter   */
                int      nRngs,     /* I - Row range info                   */
                long     *start,    /* I - Row range info                   */
                long     *end,      /* I - Row range info                   */
                int      *status )  /* O - Error status                     */
/*                                                                          */
/* Evaluate an expression using the data in the input FITS file and place   */
/* the results into either a column or keyword in the output fits file,     */
/* depending on the value of parName (keywords normally prefixed with '#')  */
/* and whether the expression evaluates to a constant or a table column.    */
/* The logic is as follows:                                                 */
/*    (1) If a column exists with name, parName, put results there.         */
/*    (2) If parName starts with '#', as in #NAXIS, put result there,       */
/*        with parInfo used as the comment. If expression does not evaluate */
/*        to a constant, flag an error.                                     */
/*    (3) If a keyword exists with name, parName, and expression is a       */
/*        constant, put result there, using parInfo as the new comment.     */
/*    (4) Else, create a new column with name parName and TFORM parInfo.    */
/*        If parInfo is NULL, use a default data type for the column.       */
/*--------------------------------------------------------------------------*/
{
   parseInfo Info;
   int naxis, constant, typecode, newNullKwd=0;
   long nelem, naxes[MAXDIMS], repeat, width;
   int col_cnt, colNo;
   Node *result;
   char card[81], tform[16], nullKwd[9], tdimKwd[9];
   ParseData lParse;

   if( *status ) return( *status );

   memset(&Info, 0, sizeof(Info));   

   if( ffiprs( infptr, 0, expr, MAXDIMS, &Info.datatype, &nelem, &naxis,
               naxes, &lParse, status ) ) {

      ffcprs(&lParse);
      return( *status );
   }
   if( nelem<0 ) {
      constant = 1;
      nelem = -nelem;
   } else
      constant = 0;

   Info.parseData = &lParse;
   /*  Case (1): If column exists put it there  */

   colNo = 0;
   ffpmrk(); /* prevent lack of column name from sullying the stack */
   ffgcno( outfptr, CASEINSEN, parName, &colNo, status );
   ffcmsg();   
   if( *status ) {

      /*  Output column doesn't exist.  Test for keyword. */

      /* Case (2): Does parName indicate result should be put into keyword */

      *status = 0;
      if( parName[0]=='#' ) {
         if( ! constant ) {
            ffcprs(&lParse);
            ffpmsg( "Cannot put tabular result into keyword (ffcalc)" );
            return( *status = PARSE_BAD_TYPE );
         }
         parName++;  /* Advance past '#' */
	 if ( (fits_strcasecmp(parName,"HISTORY") == 0 || fits_strcasecmp(parName,"COMMENT") == 0) &&
	      Info.datatype != TSTRING ) {
            ffcprs(&lParse);
            ffpmsg( "HISTORY and COMMENT values must be strings (ffcalc)" );
	    return( *status = PARSE_BAD_TYPE );
	 }

      } else if( constant ) {

         /* Case (3): Does a keyword named parName already exist */

         if( ffgcrd( outfptr, parName, card, status )==KEY_NO_EXIST ) {
            colNo = -1;
         } else if( *status ) {
            ffcprs(&lParse);
            return( *status );
         }

      } else
         colNo = -1;

      if( colNo<0 ) {

         /* Case (4): Create new column */

         *status = 0;
         ffgncl( outfptr, &colNo, status );
         colNo++;
         if( parInfo==NULL || *parInfo=='\0' ) {
            /*  Figure out best default column type  */
            if( lParse.hdutype==BINARY_TBL ) {
               snprintf(tform,15,"%ld",nelem);
               switch( Info.datatype ) {
               case TLOGICAL:  strcat(tform,"L");  break;
               case TLONG:     strcat(tform,"J");  break;
               case TDOUBLE:   strcat(tform,"D");  break;
               case TSTRING:   strcat(tform,"A");  break;
               case TBIT:      strcat(tform,"X");  break;
               case TLONGLONG: strcat(tform,"K");  break;
               }
            } else {
               switch( Info.datatype ) {
               case TLOGICAL:
                  ffcprs(&lParse);
                  ffpmsg("Cannot create LOGICAL column in ASCII table");
                  return( *status = NOT_BTABLE );
               case TLONG:     strcpy(tform,"I11");     break;
               case TDOUBLE:   strcpy(tform,"D23.15");  break;
               case TSTRING:   
               case TBIT:      snprintf(tform,16,"A%ld",nelem);  break;
               }
            }
            parInfo = tform;
         } else if( !(isdigit((int) *parInfo)) && lParse.hdutype==BINARY_TBL ) {
            if( Info.datatype==TBIT && *parInfo=='B' )
               nelem = (nelem+7)/8;
            snprintf(tform,16,"%ld%s",nelem,parInfo);
            parInfo = tform;
         }
         fficol( outfptr, colNo, parName, parInfo, status );
         if( naxis>1 )
            ffptdm( outfptr, colNo, naxis, naxes, status );

         /*  Setup TNULLn keyword in case NULLs are encountered  */

         ffkeyn("TNULL", colNo, nullKwd, status);
         if( ffgcrd( outfptr, nullKwd, card, status )==KEY_NO_EXIST ) {
            *status = 0;
            if( lParse.hdutype==BINARY_TBL ) {
	       LONGLONG nullVal=0;
               fits_binary_tform( parInfo, &typecode, &repeat, &width, status );
               if( typecode==TBYTE )
                  nullVal = UCHAR_MAX;
               else if( typecode==TSHORT )
                  nullVal = SHRT_MIN;
               else if( typecode==TINT )
                  nullVal = INT_MIN;
               else if( typecode==TLONG ) {
                  if (sizeof(long) == 8 && sizeof(int) == 4)
                     nullVal = INT_MIN;
                  else
                     nullVal = LONG_MIN;
               }
               else if( typecode==TLONGLONG )
                  nullVal = LONGLONG_MIN;
		  
               if( nullVal ) {
                  ffpkyj( outfptr, nullKwd, nullVal, "Null value", status );
                  fits_set_btblnull( outfptr, colNo, nullVal, status );
                  newNullKwd = 1;
               }
            } else if( lParse.hdutype==ASCII_TBL ) {
               ffpkys( outfptr, nullKwd, "NULL", "Null value string", status );
               fits_set_atblnull( outfptr, colNo, "NULL", status );
               newNullKwd = 1;
            }
         }

      }

   } else if( *status ) {
      ffcprs(&lParse);
      return( *status );
   } else {

      /********************************************************/
      /*  Check if a TDIM keyword should be written/updated.  */
      /********************************************************/

      ffkeyn("TDIM", colNo, tdimKwd, status);
      ffgcrd( outfptr, tdimKwd, card, status );
      if( *status==0 ) {
         /*  TDIM exists, so update it with result's dimension  */
         ffptdm( outfptr, colNo, naxis, naxes, status );
      } else if( *status==KEY_NO_EXIST ) {
         /*  TDIM does not exist, so clear error stack and     */
         /*  write a TDIM only if result is multi-dimensional  */
         *status = 0;
         ffcmsg();
         if( naxis>1 )
            ffptdm( outfptr, colNo, naxis, naxes, status );
      }
      if( *status ) {
         /*  Either some other error happened in ffgcrd   */
         /*  or one happened in ffptdm                    */
         ffcprs(&lParse);
         return( *status );
      }

   }

   if( colNo>0 ) {

      /*  Output column exists (now)... put results into it  */

      int anyNull = 0;
      int nPerLp, i;
      long totaln;

      ffgkyj(infptr, "NAXIS2", &totaln, 0, status);

      /*************************************/
      /* Create new iterator Output Column */
      /*************************************/

      col_cnt = lParse.nCols;
      if( fits_parser_allocateCol( &lParse, col_cnt, status ) ) {
         ffcprs(&lParse);
         return( *status );
      }

      fits_iter_set_by_num( lParse.colData+col_cnt, outfptr,
                            colNo, 0, OutputCol );
      lParse.nCols++;

      for( i=0; i<nRngs; i++ ) {
         Info.dataPtr = NULL;
         Info.maxRows = end[i]-start[i]+1;

          /*
            If there is only 1 range, and it includes all the rows,
            and there are 10 or more rows, then set nPerLp = 0 so
            that the iterator function will dynamically choose the
            most efficient number of rows to process in each loop.
            Otherwise, set nPerLp to the number of rows in this range.
         */

         if( (Info.maxRows >= 10) && (nRngs == 1) &&
             (start[0] == 1) && (end[0] == totaln))
              nPerLp = 0;
         else
              nPerLp = Info.maxRows;

         if( ffiter( lParse.nCols, lParse.colData, start[i]-1,
                     nPerLp, fits_parser_workfn, (void*)&Info, status ) == -1 )
            *status = 0;
         else if( *status ) {
            ffcprs(&lParse);
            return( *status );
         }
         if( Info.anyNull ) anyNull = 1;
      }

      if( newNullKwd && !anyNull ) {
         ffdkey( outfptr, nullKwd, status );
      }

   } else {

      /* Put constant result into keyword */

      result  = lParse.Nodes + lParse.resultNode;
      switch( Info.datatype ) {
      case TDOUBLE:
         ffukyd( outfptr, parName, result->value.data.dbl, 15,
                 parInfo, status );
         break;
      case TLONG:
         ffukyj( outfptr, parName, result->value.data.lng, parInfo, status );
         break;
      case TLOGICAL:
         ffukyl( outfptr, parName, result->value.data.log, parInfo, status );
         break;
      case TBIT:
      case TSTRING:
	 if (fits_strcasecmp(parName,"HISTORY") == 0) {
	   ffphis( outfptr, result->value.data.str, status);
	 } else if (fits_strcasecmp(parName,"COMMENT") == 0) {
	   ffpcom( outfptr, result->value.data.str, status);
	 } else {
	   ffukys( outfptr, parName, result->value.data.str, parInfo, status );
	 }
         break;
      }
   }

   ffcprs(&lParse);
   return( *status );
}